

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

token * __thiscall libchars::commands::find_key(commands *this,char *name)

{
  bool bVar1;
  bool bVar2;
  commands *local_28;
  token *T;
  char *name_local;
  commands *this_local;
  
  if (name == (char *)0x0) {
    this_local = (commands *)0x0;
  }
  else if (this->cmd == (command *)0x0) {
    this_local = (commands *)0x0;
  }
  else {
    local_28 = (commands *)this->t_par;
    while( true ) {
      bVar2 = false;
      if (local_28 != (commands *)0x0) {
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)(local_28->super_edit_object).buffer + 0x18),name);
        bVar2 = true;
        if (!bVar1) {
          bVar2 = *(int *)((long)(local_28->super_edit_object).buffer + 0x38) != 2;
        }
      }
      if (!bVar2) break;
      local_28 = *(commands **)((long)(local_28->super_edit_object).buffer + 0x80);
    }
    if (local_28 != (commands *)0x0) {
      if (*(long *)((long)(local_28->super_edit_object).buffer + 0x80) == 0) {
        return (token *)0x0;
      }
      if (*(int *)(*(long *)((long)(local_28->super_edit_object).buffer + 0x80) + 0x40) != 2) {
        return (token *)0x0;
      }
      if ((*(uint *)(*(long *)((long)(local_28->super_edit_object).buffer + 0x80) + 0x6c) & 0x800)
          == 0) {
        return (token *)0x0;
      }
    }
    this_local = local_28;
  }
  return (token *)this_local;
}

Assistant:

token *commands::find_key(const char *name)
    {
        if (name == NULL)
            return NULL;
        if (cmd == NULL)
            return NULL;

        token *T = t_par;
        while (T != NULL && (T->name != name || T->ttype != token::KEY))
            T = T->next;

        if (T != NULL) {
            if (T->next == NULL)
                return NULL; // {key,value} pair missing 'value'
            else if (T->next->ttype != token::KEY)
                return NULL; // {key,value} pair missing 'value'
            else if (!(T->next->status & token::IS_VALUE))
                return NULL; // {key,value} pair invalid 'value'
        }

        return T;
    }